

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.cpp
# Opt level: O2

void ncnn::matmul_transb(Mat *A,Mat *B,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  float *pfVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int k;
  ulong uVar11;
  void *pvVar12;
  int j;
  ulong uVar13;
  float sum;
  float fVar14;
  
  uVar1 = A->w;
  uVar2 = B->h;
  pvVar7 = A->data;
  pvVar3 = B->data;
  pvVar4 = top_blob->data;
  uVar8 = 0;
  uVar9 = 0;
  if (0 < (int)uVar1) {
    uVar9 = (ulong)uVar1;
  }
  uVar10 = 0;
  if (0 < (int)uVar2) {
    uVar10 = (ulong)uVar2;
  }
  uVar5 = (ulong)(uint)A->h;
  if (A->h < 1) {
    uVar5 = uVar8;
  }
  for (; uVar8 != uVar5; uVar8 = uVar8 + 1) {
    pfVar6 = (float *)((long)pvVar4 + uVar8 * (long)(int)uVar2 * 4);
    pvVar12 = pvVar3;
    for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
      fVar14 = 0.0;
      for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
        fVar14 = fVar14 + *(float *)((long)pvVar12 + uVar11 * 4) *
                          *(float *)((long)pvVar7 + uVar11 * 4);
      }
      *pfVar6 = fVar14;
      pfVar6 = pfVar6 + 1;
      pvVar12 = (void *)((long)pvVar12 + (long)(int)uVar1 * 4);
    }
    pvVar7 = (void *)((long)pvVar7 + (long)(int)uVar1 * 4);
  }
  return;
}

Assistant:

static void matmul_transb(const Mat& A, const Mat& B, Mat& top_blob, const Option& opt)
{
    const int M = A.h;
    const int K = A.w; // assert A.w == B.w
    const int N = B.h;

    const float* pA = A;
    const float* pB = B;
    float* pOut = top_blob;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < M; i++)
    {
        const float* ptrA = pA + i * K;
        float* outptr = pOut + i * N;

        for (int j = 0; j < N; j++)
        {
            const float* ptrB = pB + j * K;

            float sum = 0.f;
            for (int k = 0; k < K; k++)
            {
                sum += ptrA[k] * ptrB[k];
            }

            *outptr++ = sum;
        }
    }
}